

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::reserve(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          *this,size_t n)

{
  ulong uVar1;
  ParsedParameter **ppPVar2;
  int i;
  ulong uVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  
  if (this->ptr == (ParsedParameter **)0x0) {
    uVar1 = 8;
  }
  else {
    uVar1 = this->nAlloc;
  }
  if (uVar1 < n) {
    ppPVar2 = pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
              allocate_object<pbrt::ParsedParameter*>
                        ((polymorphic_allocator<pbrt::ParsedParameter*> *)this,n);
    uVar1 = this->nStored;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)this->ptr;
      if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
           *)this->ptr ==
          (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
           *)0x0) {
        paVar4 = &this->field_2;
      }
      ppPVar2[uVar3] = paVar4->fixed[uVar3];
    }
    pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
    deallocate_object<pbrt::ParsedParameter*>
              ((polymorphic_allocator<pbrt::ParsedParameter*> *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = ppPVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }